

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory_tree.cc
# Opt level: O1

void memory_tree_ns::learn_at_leaf_random
               (memory_tree *b,single_learner *base,uint32_t *leaf_id,example *ec,float *weight)

{
  uint64_t *puVar1;
  int iVar2;
  node *pnVar3;
  uint *puVar4;
  example *peVar5;
  uint uVar6;
  float fVar7;
  float fVar8;
  
  b->total_num_queries = b->total_num_queries + 1;
  pnVar3 = (b->nodes)._begin;
  if (pnVar3[*leaf_id].examples_index._end == pnVar3[*leaf_id].examples_index._begin) {
    uVar6 = 0xffffffff;
  }
  else {
    fVar7 = merand48(&b->all->random_state);
    pnVar3 = (b->nodes)._begin;
    puVar4 = pnVar3[*leaf_id].examples_index._begin;
    uVar6 = puVar4[(long)(fVar7 * (float)(ulong)((long)pnVar3[*leaf_id].examples_index._end -
                                                 (long)puVar4 >> 2)) & 0xffffffff];
  }
  if (uVar6 != 0xffffffff) {
    peVar5 = (b->examples)._begin[(int)uVar6];
    if ((peVar5->l).multi.label == (ec->l).multi.label) {
      fVar7 = 1.0;
    }
    else {
      fVar7 = 0.0;
    }
    fVar8 = normalized_linear_prod(b,ec,peVar5);
    diag_kronecker_product_test(ec,(b->examples)._begin[(int)uVar6],b->kprod_ec,b->oas);
    peVar5 = b->kprod_ec;
    (peVar5->l).simple.label = fVar7;
    (peVar5->l).simple.weight = 1.0;
    (peVar5->l).simple.initial = -fVar8;
    b->kprod_ec->weight = *weight;
    peVar5 = b->kprod_ec;
    iVar2 = (int)b->max_routers;
    puVar1 = &(peVar5->super_example_predict).ft_offset;
    *puVar1 = *puVar1 + (ulong)(uint)(*(int *)(base + 0xe0) * iVar2);
    (**(code **)(base + 0x28))(*(undefined8 *)(base + 0x18),*(undefined8 *)(base + 0x20),peVar5);
    puVar1 = &(peVar5->super_example_predict).ft_offset;
    *puVar1 = *puVar1 - (ulong)(uint)(iVar2 * *(int *)(base + 0xe0));
  }
  return;
}

Assistant:

void learn_at_leaf_random(memory_tree& b, single_learner& base, const uint32_t& leaf_id, example& ec, const float& weight){
        b.total_num_queries ++;
        int32_t ec_id = -1;
        float reward = 0.f;
        if (b.nodes[leaf_id].examples_index.size() > 0){
            uint32_t pos = uint32_t(merand48(b.all->random_state) * b.nodes[leaf_id].examples_index.size());
			ec_id = b.nodes[leaf_id].examples_index[pos];
        }
        if (ec_id != -1){
            if (b.examples[ec_id]->l.multi.label == ec.l.multi.label)
                reward = 1.f;             
            float score = normalized_linear_prod(b, &ec, b.examples[ec_id]);
            diag_kronecker_product_test(ec, *b.examples[ec_id], *b.kprod_ec, b.oas);
         	b.kprod_ec->l.simple = {reward, 1.f, -score};
	    	b.kprod_ec->weight = weight; //* b.nodes[leaf_id].examples_index.size();
            base.learn(*b.kprod_ec, b.max_routers);
        }
        return;
    }